

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

DeepTiledInputFile * __thiscall
Imf_3_4::MultiPartInputFile::getInputPart<Imf_3_4::DeepTiledInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  pthread_mutex_t *__mutex;
  pointer pPVar1;
  ulong uVar2;
  element_type *peVar3;
  DeepTiledInputFile *this_00;
  ostream *poVar4;
  ArgExc *this_01;
  any aStack_1c8;
  file_storage f;
  ostream local_1a8 [376];
  
  uVar2 = (ulong)(uint)partNumber;
  if ((-1 < partNumber) &&
     (__mutex = (pthread_mutex_t *)
                (this->_data).
                super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,
     uVar2 < (ulong)((*(long *)((long)__mutex + 0x30) - __mutex[1].__align) / 0x60))) {
    std::mutex::lock((mutex *)&__mutex->__data);
    f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pPVar1 = (((this->_data).
               super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->parts).
             super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((any *)((long)(pPVar1 + uVar2) + 0x50))->_M_manager ==
        (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (DeepTiledInputFile *)operator_new(0x20);
      DeepTiledInputFile::DeepTiledInputFile(this_00,&pPVar1[uVar2].data);
      std::__shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>::
      reset<Imf_3_4::DeepTiledInputFile>
                (&f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>,
                 this_00);
      std::any::operator=((any *)((long)((((this->_data).
                                           super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->parts).
                                         super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x50),
                          &f);
    }
    else {
      std::any_cast<std::shared_ptr<Imf_3_4::DeepTiledInputFile>>(&aStack_1c8);
      std::__shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2> *)
                 &aStack_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_1c8._M_storage);
    }
    peVar3 = f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f.super___shared_ptr<Imf_3_4::DeepTiledInputFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pthread_mutex_unlock(__mutex);
    return peVar3;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&f);
  poVar4 = std::operator<<(local_1a8,"MultiPartInputFile::getPart called with invalid part ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,partNumber);
  poVar4 = std::operator<<(poVar4," on file with ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," parts");
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_01,(stringstream *)&f);
  __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartInputFile::getInputPart (int partNumber)
{
    if (partNumber < 0 || static_cast<size_t> (partNumber) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << partNumber << " on file with " << _data->parts.size () << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    using file_storage = std::shared_ptr<T>;
    file_storage f;
    if (!_data->parts[partNumber].file.has_value ())
    {
        // TODO: change to copy / value semantics
        // stupid make_shared and friend functions, can we remove this restriction?
        // f = std::make_shared<T> (&(_data->parts[partNumber].data));
        f.reset (new T (&(_data->parts[partNumber].data)));
        _data->parts[partNumber].file = f;
    }
    else
        f = std::any_cast<file_storage> (_data->parts[partNumber].file);

    // TODO: change to by reference / value semantics
    return f.get();
}